

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O2

_Bool ggml_backend_sched_alloc_graph(ggml_backend_sched_t sched,ggml_cgraph *graph)

{
  uint uVar1;
  _Bool _Var2;
  ulong uVar3;
  ulong uVar4;
  
  if ((int)(sched->hash_set).size < graph->n_leafs + graph->n_nodes) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-backend.cpp"
               ,0x617,"GGML_ASSERT(%s) failed",
               "(int)sched->hash_set.size >= graph->n_nodes + graph->n_leafs");
  }
  ggml_backend_sched_split_graph(sched,graph);
  uVar1 = (sched->graph).n_nodes;
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    if ((sched->node_backend_ids[uVar4] != sched->prev_node_backend_ids[uVar4]) &&
       (sched->bufts[sched->node_backend_ids[uVar4]] !=
        sched->bufts[sched->prev_node_backend_ids[uVar4]])) goto LAB_0012c710;
  }
  uVar1 = (sched->graph).n_leafs;
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    if ((sched->leaf_backend_ids[uVar4] != sched->prev_leaf_backend_ids[uVar4]) &&
       (sched->bufts[sched->leaf_backend_ids[uVar4]] !=
        sched->bufts[sched->prev_leaf_backend_ids[uVar4]])) goto LAB_0012c710;
  }
  _Var2 = ggml_gallocr_alloc_graph(sched->galloc,&sched->graph);
  if (!_Var2) {
LAB_0012c710:
    ggml_backend_sched_synchronize(sched);
    ggml_gallocr_reserve_n
              (sched->galloc,&sched->graph,sched->node_backend_ids,sched->leaf_backend_ids);
    _Var2 = ggml_gallocr_alloc_graph(sched->galloc,&sched->graph);
    if (!_Var2) {
      ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate graph\n",
                        "ggml_backend_sched_alloc_splits");
      return false;
    }
  }
  sched->is_alloc = true;
  return true;
}

Assistant:

bool ggml_backend_sched_alloc_graph(ggml_backend_sched_t sched, struct ggml_cgraph * graph) {
    GGML_ASSERT((int)sched->hash_set.size >= graph->n_nodes + graph->n_leafs);

    ggml_backend_sched_split_graph(sched, graph);


    if (!ggml_backend_sched_alloc_splits(sched)) {
        return false;
    }

    sched->is_alloc = true;

    return true;
}